

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

bool __thiscall amrex::FabArray<amrex::FArrayBox>::isAllRegular(FabArray<amrex::FArrayBox> *this)

{
  pointer pFVar1;
  EBFArrayBoxFactory *f;
  long local_28;
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  *in_stack_ffffffffffffffe0;
  bool local_1;
  
  pFVar1 = std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::get(in_stack_ffffffffffffffe0);
  if (pFVar1 == (pointer)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = __dynamic_cast(pFVar1,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0);
  }
  if (local_28 == 0) {
    local_1 = true;
  }
  else {
    local_1 = EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x129b39a);
  }
  return local_1;
}

Assistant:

bool isAllRegular () const noexcept {
#ifdef AMREX_USE_EB
        const auto f = dynamic_cast<EBFArrayBoxFactory const*>(m_factory.get());
        if (f) {
            return f->isAllRegular();
        } else {
            return true;
        }
#else
        return true;
#endif
    }